

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O1

void __thiscall
FastPForLib::Simple9<true,_false>::encodeArray
          (Simple9<true,_false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  bool bVar1;
  bool bVar2;
  uint extraout_EAX;
  long lVar3;
  ulong uVar4;
  runtime_error *prVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  uint32_t *puVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  uint32_t uVar11;
  int iVar12;
  uint uVar13;
  
  *out = (uint32_t)length;
  puVar7 = out + 1;
  if (0x1b < length) {
    do {
      if (*in < 2) {
        uVar4 = 0;
        do {
          uVar9 = uVar4;
          if (uVar9 == 0x1b) break;
          uVar4 = uVar9 + 1;
        } while (in[uVar9 + 1] < 2);
        if (uVar9 < 0x1b) goto LAB_00127215;
        *puVar7 = 0;
        lVar3 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 * 2 | *(uint *)((long)in + lVar3);
          *puVar7 = uVar8;
          lVar3 = lVar3 + 4;
        } while ((int)lVar3 != 0x70);
        in = (uint32_t *)((long)in + lVar3);
        lVar3 = -0x1c;
      }
      else {
LAB_00127215:
        if (*in < 4) {
          uVar4 = 0;
          do {
            uVar9 = uVar4;
            if (uVar9 == 0xd) break;
            uVar4 = uVar9 + 1;
          } while (in[uVar9 + 1] < 4);
          if (0xc < uVar9) {
            *puVar7 = 1;
            uVar8 = 1;
            lVar3 = 0;
            do {
              uVar8 = uVar8 << 2 | *(uint *)((long)in + lVar3);
              *puVar7 = uVar8;
              lVar3 = lVar3 + 4;
            } while ((int)lVar3 != 0x38);
            in = (uint32_t *)((long)in + lVar3);
            lVar3 = -0xe;
            goto LAB_0012744f;
          }
        }
        if (*in < 8) {
          uVar4 = 0;
          do {
            uVar9 = uVar4;
            if (uVar9 == 8) break;
            uVar4 = uVar9 + 1;
          } while (in[uVar9 + 1] < 8);
          if (uVar9 < 8) goto LAB_001272c1;
          *puVar7 = 2;
          uVar8 = 2;
          lVar3 = 0;
          do {
            uVar8 = uVar8 << 3 | *(uint *)((long)in + lVar3);
            *puVar7 = uVar8;
            lVar3 = lVar3 + 4;
          } while ((int)lVar3 != 0x24);
          uVar11 = *puVar7 * 2;
          in = (uint32_t *)((long)in + lVar3);
          lVar3 = -9;
        }
        else {
LAB_001272c1:
          if (*in < 0x10) {
            uVar4 = 0;
            do {
              uVar9 = uVar4;
              if (uVar9 == 6) break;
              uVar4 = uVar9 + 1;
            } while (in[uVar9 + 1] < 0x10);
            if (5 < uVar9) {
              *puVar7 = 3;
              uVar8 = 3;
              lVar3 = 0;
              do {
                uVar8 = uVar8 << 4 | *(uint *)((long)in + lVar3);
                *puVar7 = uVar8;
                lVar3 = lVar3 + 4;
              } while ((int)lVar3 != 0x1c);
              in = (uint32_t *)((long)in + lVar3);
              lVar3 = -7;
              goto LAB_0012744f;
            }
          }
          if (*in < 0x20) {
            uVar4 = 0;
            do {
              uVar9 = uVar4;
              if (uVar9 == 4) break;
              uVar4 = uVar9 + 1;
            } while (in[uVar9 + 1] < 0x20);
            if (3 < uVar9) {
              *puVar7 = 4;
              uVar8 = 4;
              lVar3 = 0;
              do {
                uVar8 = uVar8 << 5 | *(uint *)((long)in + lVar3);
                *puVar7 = uVar8;
                lVar3 = lVar3 + 4;
              } while ((int)lVar3 != 0x14);
              uVar11 = *puVar7 << 3;
              in = (uint32_t *)((long)in + lVar3);
              lVar3 = -5;
              goto LAB_0012744c;
            }
          }
          if (*in < 0x80) {
            uVar4 = 0;
            do {
              uVar9 = uVar4;
              if (uVar9 == 3) break;
              uVar4 = uVar9 + 1;
            } while (in[uVar9 + 1] < 0x80);
            if (2 < uVar9) {
              *puVar7 = 5;
              uVar8 = 5;
              lVar3 = 0;
              do {
                uVar8 = uVar8 << 7 | *(uint *)((long)in + lVar3);
                *puVar7 = uVar8;
                lVar3 = lVar3 + 4;
              } while ((int)lVar3 != 0x10);
              in = (uint32_t *)((long)in + lVar3);
              lVar3 = -4;
              goto LAB_0012744f;
            }
          }
          if (*in < 0x200) {
            uVar4 = 0;
            do {
              uVar9 = uVar4;
              if (uVar9 == 2) break;
              uVar4 = uVar9 + 1;
            } while (in[uVar9 + 1] < 0x200);
            if (1 < uVar9) {
              *puVar7 = 6;
              uVar8 = 6;
              lVar3 = 0;
              do {
                uVar8 = uVar8 << 9 | *(uint *)((long)in + lVar3);
                *puVar7 = uVar8;
                lVar3 = lVar3 + 4;
              } while ((int)lVar3 != 0xc);
              uVar11 = *puVar7 * 2;
              in = (uint32_t *)((long)in + lVar3);
              lVar3 = -3;
              goto LAB_0012744c;
            }
          }
          if (*in < 0x4000) {
            bVar2 = true;
            do {
              bVar1 = bVar2;
              if (!bVar1) goto LAB_0012747e;
              bVar2 = false;
            } while (in[1] < 0x4000);
            if (!bVar1) {
LAB_0012747e:
              *puVar7 = 7;
              uVar8 = 7;
              lVar3 = 0;
              do {
                uVar8 = uVar8 << 0xe | *(uint *)((long)in + lVar3);
                *puVar7 = uVar8;
                lVar3 = lVar3 + 4;
              } while ((int)lVar3 == 4);
              in = (uint32_t *)((long)in + lVar3);
              lVar3 = -2;
              goto LAB_0012744f;
            }
          }
          uVar8 = *in;
          if (0xfffffff < uVar8) goto LAB_00127885;
          *puVar7 = 8;
          uVar11 = *in | 0x80000000;
          in = in + 1;
          lVar3 = -1;
        }
LAB_0012744c:
        *puVar7 = uVar11;
      }
LAB_0012744f:
      length = length + lVar3;
      puVar7 = puVar7 + 1;
    } while (0x1b < length);
  }
  do {
    if (length == 0) {
      *nvalue = (long)puVar7 - (long)out >> 2;
      return;
    }
    uVar4 = 0x1c;
    if (length < 0x1c) {
      uVar4 = length;
    }
    if (*in < 2) {
      uVar9 = 1;
      do {
        uVar6 = uVar9;
        if (uVar4 == uVar6) break;
        uVar9 = uVar6 + 1;
      } while (in[uVar6] < 2);
      if (uVar6 < uVar4) goto LAB_001274f4;
      *puVar7 = 0;
      iVar12 = (int)uVar4 + (uint)((int)uVar4 == 0);
      uVar8 = 0;
      do {
        uVar8 = uVar8 * 2 | *in;
        in = in + 1;
        *puVar7 = uVar8;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      cVar10 = -(char)uVar4;
LAB_001277e2:
      uVar8 = (uint)uVar4;
      uVar11 = *puVar7 << ((byte)(cVar10 + 0x1c) & 0x1f);
    }
    else {
LAB_001274f4:
      uVar4 = 0xe;
      if (length < 0xe) {
        uVar4 = length;
      }
      if (*in < 4) {
        uVar9 = 1;
        do {
          uVar6 = uVar9;
          if (uVar4 == uVar6) break;
          uVar9 = uVar6 + 1;
        } while (in[uVar6] < 4);
        if (uVar6 < uVar4) goto LAB_00127527;
        *puVar7 = 1;
        iVar12 = (int)uVar4 + (uint)((int)uVar4 == 0);
        uVar8 = 1;
        do {
          uVar8 = uVar8 << 2 | *in;
          in = in + 1;
          *puVar7 = uVar8;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        cVar10 = (char)uVar4 * '\x02';
LAB_00127741:
        cVar10 = -cVar10;
LAB_00127746:
        uVar8 = (uint)uVar4;
        uVar11 = *puVar7 << ((byte)(cVar10 + 0x1c) & 0x1f);
      }
      else {
LAB_00127527:
        uVar4 = 9;
        if (length < 9) {
          uVar4 = length;
        }
        if (*in < 8) {
          uVar9 = 1;
          do {
            uVar6 = uVar9;
            if (uVar4 == uVar6) break;
            uVar9 = uVar6 + 1;
          } while (in[uVar6] < 8);
          if (uVar6 < uVar4) goto LAB_0012755a;
          *puVar7 = 2;
          iVar12 = (int)uVar4 + (uint)((int)uVar4 == 0);
          uVar8 = 2;
          do {
            uVar8 = uVar8 << 3 | *in;
            in = in + 1;
            *puVar7 = uVar8;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
          cVar10 = (char)uVar4 * '\x03';
LAB_001277db:
          cVar10 = -cVar10;
          goto LAB_001277e2;
        }
LAB_0012755a:
        uVar4 = 7;
        if (length < 7) {
          uVar4 = length;
        }
        if (*in < 0x10) {
          uVar9 = 1;
          do {
            uVar6 = uVar9;
            if (uVar4 == uVar6) break;
            uVar9 = uVar6 + 1;
          } while (in[uVar6] < 0x10);
          if (uVar4 <= uVar6) {
            *puVar7 = 3;
            iVar12 = (int)uVar4 + (uint)((int)uVar4 == 0);
            uVar8 = 3;
            do {
              uVar8 = uVar8 << 4 | *in;
              in = in + 1;
              *puVar7 = uVar8;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
            cVar10 = (char)uVar4 * '\x04';
            goto LAB_00127741;
          }
        }
        uVar4 = 5;
        if (length < 5) {
          uVar4 = length;
        }
        if (*in < 0x20) {
          uVar9 = 1;
          do {
            uVar6 = uVar9;
            if (uVar4 == uVar6) break;
            uVar9 = uVar6 + 1;
          } while (in[uVar6] < 0x20);
          if (uVar4 <= uVar6) {
            *puVar7 = 4;
            iVar12 = (int)uVar4 + (uint)((int)uVar4 == 0);
            uVar8 = 4;
            do {
              uVar8 = uVar8 << 5 | *in;
              in = in + 1;
              *puVar7 = uVar8;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
            cVar10 = (char)uVar4 * '\x05';
            goto LAB_001277db;
          }
        }
        uVar4 = 4;
        if (length < 4) {
          uVar4 = length;
        }
        if (*in < 0x80) {
          uVar9 = 1;
          do {
            uVar6 = uVar9;
            if (uVar4 == uVar6) break;
            uVar9 = uVar6 + 1;
          } while (in[uVar6] < 0x80);
          if (uVar4 <= uVar6) {
            *puVar7 = 5;
            iVar12 = (int)uVar4 + (uint)((int)uVar4 == 0);
            uVar8 = 5;
            do {
              uVar8 = uVar8 << 7 | *in;
              in = in + 1;
              *puVar7 = uVar8;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
            cVar10 = (char)uVar4 * -7;
            goto LAB_00127746;
          }
        }
        uVar4 = 3;
        if (length < 3) {
          uVar4 = length;
        }
        if (*in < 0x200) {
          uVar9 = 1;
          do {
            uVar6 = uVar9;
            if (uVar4 == uVar6) break;
            uVar9 = uVar6 + 1;
          } while (in[uVar6] < 0x200);
          if (uVar4 <= uVar6) {
            *puVar7 = 6;
            iVar12 = (int)uVar4 + (uint)((int)uVar4 == 0);
            uVar8 = 6;
            do {
              uVar8 = uVar8 << 9 | *in;
              in = in + 1;
              *puVar7 = uVar8;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
            cVar10 = (char)uVar4 * '\t';
            goto LAB_001277db;
          }
        }
        if (*in < 0x4000) {
          uVar4 = 2;
          if (length < 2) {
            uVar4 = length;
          }
          uVar9 = 1;
          do {
            uVar6 = uVar9;
            if (uVar4 == uVar6) break;
            uVar9 = uVar6 + 1;
          } while (in[uVar6] < 0x4000);
          if (uVar4 <= uVar6) {
            *puVar7 = 7;
            uVar8 = (length != 1) + 1;
            uVar4 = (ulong)uVar8;
            uVar13 = 7;
            do {
              uVar13 = uVar13 << 0xe | *in;
              in = in + 1;
              *puVar7 = uVar13;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
            cVar10 = (char)(-0xe << (length != 1));
            goto LAB_001277e2;
          }
        }
        if (0xfffffff < *in) {
          fprintf(_stderr,"Input\'s out of range: %u\n",(ulong)*in);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"You tried to apply Simple9 to an incompatible set of integers.");
          Simple9<true,false>::encodeArray(prVar5);
          uVar8 = extraout_EAX;
LAB_00127885:
          fprintf(_stderr,"Input\'s out of range: %u\n",(ulong)uVar8);
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"You tried to apply Simple9 to an incompatible set of integers.");
          Simple9<true,false>::encodeArray(prVar5);
          __cxa_free_exception(prVar5);
          _Unwind_Resume(extraout_RAX);
        }
        *puVar7 = 8;
        uVar11 = *in | 0x80000000;
        in = in + 1;
        uVar8 = 1;
      }
    }
    *puVar7 = uVar11;
    puVar7 = puVar7 + 1;
    length = length - uVar8;
  } while( true );
}

Assistant:

void Simple9<MarkLength, hacked>::encodeArray(const uint32_t *in,
                                              const size_t length,
                                              uint32_t *out, size_t &nvalue) {
  uint32_t NumberOfValuesCoded;
  const uint32_t *const initout(out);
  if (MarkLength)
    *(out++) = uint32_t(length);
  size_t ValuesRemaining(length);
  // precompute
  const bool becareful = false;

  while (ValuesRemaining >= 28) {
    if (hacked && trymefull<28, 0>(in)) {
      out[0] = 9 << (32 - SIMPLE9_LOGDESC);
      NumberOfValuesCoded = 28;
      in += 28;
    } else if (trymefull<28, 1>(in)) {
      out[0] = 0;
      NumberOfValuesCoded = 28;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 1);
      if (becareful)
        assert(which(out) == 0);
    } else if (trymefull<14, 2>(in)) {
      out[0] = 1;
      NumberOfValuesCoded = 14;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 2);
      if (becareful)
        assert(which(out) == 1);
    } else if (trymefull<9, 3>(in)) {
      out[0] = 2;
      NumberOfValuesCoded = 9;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 3);
      *out <<= 28 - 3 * 9;
      if (becareful)
        assert(which(out) == 2);
    } else if (trymefull<7, 4>(in)) {
      out[0] = 3;

      NumberOfValuesCoded = 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 4);
      if (becareful)
        assert(which(out) == 7);
    } else if (trymefull<5, 5>(in)) {
      out[0] = 4;

      NumberOfValuesCoded = 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 5);
      *out <<= 28 - 5 * 5;
      if (becareful)
        assert(which(out) == 4);
    } else if (trymefull<4, 7>(in)) {
      out[0] = 5;
      NumberOfValuesCoded = 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 7);

      if (becareful)
        assert(which(out) == 5);
    } else if (trymefull<3, 9>(in)) {
      out[0] = 6;
      NumberOfValuesCoded = 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 9);
      *out <<= 28 - 9 * 3;
      if (becareful)
        assert(which(out) == 6);
    } else if (trymefull<2, 14>(in)) {
      out[0] = 7;

      NumberOfValuesCoded = 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 14);

      if (becareful)
        assert(which(out) == 14);
    } else {
      if ((*in >> 28) > 0) {
        fprintf(stderr, "Input's out of range: %u\n", *in);
        throw std::runtime_error(
            "You tried to apply Simple9 to an incompatible set of integers.");
      }

      out[0] = 8;

      NumberOfValuesCoded = 1;
      bit_writer(out, *in++, 28);
      if (becareful)
        assert(which(out) == 15);
    }

    ++out;

    ValuesRemaining -= NumberOfValuesCoded;
  }
  while (ValuesRemaining > 0) {
    if (hacked && trymefull<28, 0>(in)) {
      out[0] = 9 << (32 - SIMPLE9_LOGDESC);
      NumberOfValuesCoded = (ValuesRemaining < 28) ? uint32_t(ValuesRemaining) : 28;
      in += NumberOfValuesCoded;
    } else if (tryme<28, 1>(in, ValuesRemaining)) {
      out[0] = 0;

      NumberOfValuesCoded = (ValuesRemaining < 28) ? uint32_t(ValuesRemaining) : 28;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 1);
      *out <<= 28 - NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 0);
    } else if (tryme<14, 2>(in, ValuesRemaining)) {
      out[0] = 1;

      NumberOfValuesCoded = (ValuesRemaining < 14) ? uint32_t(ValuesRemaining) : 14;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 2);
      *out <<= 28 - 2 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 1);
    } else if (tryme<9, 3>(in, ValuesRemaining)) {
      out[0] = 2;
      NumberOfValuesCoded = (ValuesRemaining < 9) ? uint32_t(ValuesRemaining) : 9;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 3);
      *out <<= 28 - 3 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 2);
    } else if (tryme<7, 4>(in, ValuesRemaining)) {
      out[0] = 3;

      NumberOfValuesCoded = (ValuesRemaining < 7) ? uint32_t(ValuesRemaining) : 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 4);
      *out <<= 28 - 4 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 7);
    } else if (tryme<5, 5>(in, ValuesRemaining)) {
      out[0] = 4;

      NumberOfValuesCoded = (ValuesRemaining < 5) ? uint32_t(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 5);
      *out <<= 28 - 5 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 4);
    } else if (tryme<4, 7>(in, ValuesRemaining)) {
      out[0] = 5;
      NumberOfValuesCoded = (ValuesRemaining < 4) ? uint32_t(ValuesRemaining) : 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 7);

      *out <<= 28 - 7 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 5);
    } else if (tryme<3, 9>(in, ValuesRemaining)) {
      out[0] = 6;
      NumberOfValuesCoded = (ValuesRemaining < 3) ? uint32_t(ValuesRemaining) : 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 9);
      *out <<= 28 - 9 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 6);
    } else if (tryme<2, 14>(in, ValuesRemaining)) {
      out[0] = 7;
      NumberOfValuesCoded = (ValuesRemaining < 2) ? uint32_t(ValuesRemaining) : 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 14);
      *out <<= 28 - 14 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 14);
    } else {
      if ((*in >> 28) > 0) {
        fprintf(stderr, "Input's out of range: %u\n", *in);
        throw std::runtime_error(
            "You tried to apply Simple9 to an incompatible set of integers.");
      }
      out[0] = 8;
      NumberOfValuesCoded = 1;
      bit_writer(out, *in++, 28);
      if (becareful)
        assert(which(out) == 15);
    }
    ++out;
    ValuesRemaining -= NumberOfValuesCoded;
  }
  nvalue = out - initout;
}